

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBucket::ConstructFreelist(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeHeapBlockFreeList *freeList_00;
  Recycler *pRVar4;
  ConfigFlagsTable *pCVar5;
  LargeHeapBlockFreeList *freeList;
  LargeHeapBlock *heapBlock_local;
  LargeHeapBucket *this_local;
  
  if ((heapBlock->hasPartialFreeObjects & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f1,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = LargeHeapBlock::IsInPendingDisposeList(heapBlock);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f2,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  freeList_00 = LargeHeapBlock::GetFreeList(heapBlock);
  if (freeList_00 == (LargeHeapBlockFreeList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f8,"(freeList)","freeList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (freeList_00->entries != (LargeHeapBlockFreeListEntry *)0x0) {
    RegisterFreeList(this,freeList_00);
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    pCVar5 = Recycler::GetRecyclerFlagsTable(pRVar4);
    if ((pCVar5->Verbose & 1U) != 0) {
      pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
      pCVar5 = Recycler::GetRecyclerFlagsTable(pRVar4);
      bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,MemoryAllocationPhase);
      if (!bVar2) {
        pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
        pCVar5 = Recycler::GetRecyclerFlagsTable(pRVar4);
        bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,LargeMemoryAllocationPhase);
        if (!bVar2) goto LAB_0096ef62;
      }
      Output::Print(L"Free list created for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat);
    }
  }
LAB_0096ef62:
  ReinsertLargeHeapBlock(this,heapBlock);
  return;
}

Assistant:

void
LargeHeapBucket::ConstructFreelist(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    // The free list is the only way we reuse heap block entries
    // so if the heap block is allocated from directly, it'll not
    // invalidate the free list
    LargeHeapBlockFreeList* freeList = heapBlock->GetFreeList();
    Assert(freeList);

    if (freeList->entries)
    {
        this->RegisterFreeList(freeList);

#if DBG
        LargeAllocationVerboseTrace(this->GetRecycler()->GetRecyclerFlagsTable(), _u("Free list created for 0x%x bucket\n"), this->sizeCat);
#endif
    }

    ReinsertLargeHeapBlock(heapBlock);
}